

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O1

void smfree(small_alloc *alloc,void *ptr,size_t size)

{
  small_stats *psVar1;
  uint *puVar2;
  byte bVar3;
  mempool *pool;
  int iVar4;
  small_mempool *psVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  mslab *slab;
  
  psVar5 = (small_mempool *)0x0;
  if (size <= alloc->objsize_max) {
    puVar2 = &(alloc->small_class).size_shift_plus_1;
    uVar6 = (uint)size - *puVar2;
    if ((uint)size < *puVar2) {
      uVar6 = 0;
    }
    uVar6 = uVar6 >> ((byte)(alloc->small_class).ignore_bits_count & 0x1f);
    if ((alloc->small_class).effective_size <= uVar6) {
      bVar3 = (byte)(alloc->small_class).effective_bits;
      uVar7 = uVar6 >> (bVar3 & 0x1f);
      iVar4 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      uVar6 = (iVar4 << (bVar3 & 0x1f)) + (uVar6 >> ((byte)iVar4 & 0x1f));
    }
    psVar5 = alloc->small_mempool_cache + uVar6;
  }
  if (psVar5 == (small_mempool *)0x0) {
    slab_put_large(alloc->cache,(slab *)((long)ptr + -0x30));
    return;
  }
  slab = (mslab *)((psVar5->pool).slab_ptr_mask & (ulong)ptr);
  if ((slab->slab).magic != 0xeec0ffee) {
    __assert_fail("slab->magic == slab_magic",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/slab_cache.h"
                  ,0xd1,"struct slab *slab_from_ptr(void *, intptr_t)");
  }
  pool = slab->mempool;
  uVar6 = pool->objsize;
  uVar8 = (ulong)(uVar6 - (psVar5->pool).objsize);
  if (uVar8 <= psVar5->waste) {
    psVar5->waste = psVar5->waste - uVar8;
    if (ptr == (void *)0x0) {
      __assert_fail("ptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/mempool.h"
                    ,0x126,"void mempool_free_slab(struct mempool *, struct mslab *, void *)");
    }
    memset(ptr,0x23,(ulong)uVar6);
    if ((slab->slab).order == pool->slab_order) {
      psVar1 = &(pool->slabs).stats;
      psVar1->used = psVar1->used - (ulong)pool->objsize;
      mslab_free(pool,slab,ptr);
      return;
    }
    __assert_fail("slab->slab.order == pool->slab_order",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/mempool.h"
                  ,0x12a,"void mempool_free_slab(struct mempool *, struct mslab *, void *)");
  }
  __assert_fail("pool->waste >= slab->mempool->objsize - pool->pool.objsize",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c",
                399,"void smfree(struct small_alloc *, void *, size_t)");
}

Assistant:

void
smfree(struct small_alloc *alloc, void *ptr, size_t size)
{
	struct small_mempool *pool = small_mempool_search(alloc, size);
	if (pool == NULL) {
		/* Large allocation by slab_cache */
		struct slab *slab = slab_from_data(ptr);
		slab_put_large(alloc->cache, slab);
		return;
	}

	struct mslab *slab = (struct mslab *)
		slab_from_ptr(ptr, pool->pool.slab_ptr_mask);
	/*
	 * In case this ptr was allocated from other small mempool
	 * reducing waste for current pool (as you remember, waste
	 * in our case is memory loss due to allocation from large pools).
	 */
	assert(pool->waste >= slab->mempool->objsize - pool->pool.objsize);
	pool->waste -= slab->mempool->objsize - pool->pool.objsize;
	/* Regular allocation in mempools */
	mempool_free_slab(slab->mempool, slab, ptr);
}